

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Scaler::InternalSwap(Scaler *this,Scaler *other)

{
  RepeatedField<double> *pRVar1;
  RepeatedField<double> *pRVar2;
  intptr_t iVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  LogMessage *pLVar9;
  LogFinisher local_61;
  LogMessage local_60;
  
  iVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar3;
  pRVar1 = &this->shiftvalue_;
  pRVar2 = &other->shiftvalue_;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar9 = google::protobuf::internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar9);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    iVar7 = pRVar1->current_size_;
    iVar8 = pRVar1->total_size_;
    pvVar4 = (this->shiftvalue_).arena_or_elements_;
    iVar6 = pRVar2->total_size_;
    pvVar5 = (other->shiftvalue_).arena_or_elements_;
    pRVar1->current_size_ = pRVar2->current_size_;
    pRVar1->total_size_ = iVar6;
    (this->shiftvalue_).arena_or_elements_ = pvVar5;
    pRVar2->current_size_ = iVar7;
    pRVar2->total_size_ = iVar8;
    (other->shiftvalue_).arena_or_elements_ = pvVar4;
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar9 = google::protobuf::internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar9);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  else {
    iVar7 = pRVar1->current_size_;
    iVar8 = pRVar1->total_size_;
    pvVar4 = (this->shiftvalue_).arena_or_elements_;
    iVar6 = pRVar2->total_size_;
    pvVar5 = (other->shiftvalue_).arena_or_elements_;
    pRVar1->current_size_ = pRVar2->current_size_;
    pRVar1->total_size_ = iVar6;
    (this->shiftvalue_).arena_or_elements_ = pvVar5;
    pRVar2->current_size_ = iVar7;
    pRVar2->total_size_ = iVar8;
    (other->shiftvalue_).arena_or_elements_ = pvVar4;
  }
  iVar7 = (this->scalevalue_).current_size_;
  iVar8 = (this->scalevalue_).total_size_;
  pvVar4 = (this->scalevalue_).arena_or_elements_;
  iVar6 = (other->scalevalue_).total_size_;
  pvVar5 = (other->scalevalue_).arena_or_elements_;
  (this->scalevalue_).current_size_ = (other->scalevalue_).current_size_;
  (this->scalevalue_).total_size_ = iVar6;
  (this->scalevalue_).arena_or_elements_ = pvVar5;
  (other->scalevalue_).current_size_ = iVar7;
  (other->scalevalue_).total_size_ = iVar8;
  (other->scalevalue_).arena_or_elements_ = pvVar4;
  return;
}

Assistant:

void Scaler::InternalSwap(Scaler* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shiftvalue_.InternalSwap(&other->shiftvalue_);
  scalevalue_.InternalSwap(&other->scalevalue_);
}